

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O3

void show_bookmark_details
               (QPDFOutlineObjectHelper *outline,vector<int,_std::allocator<int>_> *numbers)

{
  uint uVar1;
  int *piVar2;
  uint __val;
  uint uVar3;
  char cVar4;
  int iVar5;
  const_iterator cVar6;
  uint *puVar7;
  ostream *poVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  int *number;
  int *piVar14;
  uint __len;
  string target;
  QPDFObjectHandle dest_page;
  string __str;
  long *local_88;
  long local_80;
  long local_78 [2];
  BaseHandle local_68;
  QPDFObjGen local_58 [2];
  long local_48 [2];
  QPDFObjGen local_38;
  
  if (style != st_none) {
    if (style == st_lines) {
      print_lines(numbers);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      print_lines(numbers);
      pcVar12 = "+-+ ";
      lVar10 = 4;
    }
    else {
      piVar2 = (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar14 = (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start; piVar14 != piVar2; piVar14 = piVar14 + 1) {
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
      }
      pcVar12 = " ";
      lVar10 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,lVar10);
  }
  if (show_open == '\x01') {
    iVar5 = QPDFOutlineObjectHelper::getCount();
    pcVar12 = "(>) ";
    if (0 < iVar5) {
      pcVar12 = "(v) ";
    }
    pcVar13 = "( ) ";
    if (iVar5 != 0) {
      pcVar13 = pcVar12;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,4);
  }
  if (show_targets == '\x01') {
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unknown","");
    QPDFOutlineObjectHelper::getDestPage();
    cVar4 = QPDFObjectHandle::isNull();
    if (cVar4 == '\0') {
      local_58[0] = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&local_68);
      cVar6 = std::
              _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
              ::find(&page_map._M_t,local_58);
      if ((_Rb_tree_header *)cVar6._M_node != &page_map._M_t._M_impl.super__Rb_tree_header) {
        local_38 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&local_68);
        puVar7 = (uint *)std::
                         map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                         ::operator[](&page_map,&local_38);
        uVar1 = *puVar7;
        __val = -uVar1;
        if (0 < (int)uVar1) {
          __val = uVar1;
        }
        __len = 1;
        if (9 < __val) {
          uVar11 = (ulong)__val;
          uVar3 = 4;
          do {
            __len = uVar3;
            uVar9 = (uint)uVar11;
            if (uVar9 < 100) {
              __len = __len - 2;
              goto LAB_001039a8;
            }
            if (uVar9 < 1000) {
              __len = __len - 1;
              goto LAB_001039a8;
            }
            if (uVar9 < 10000) goto LAB_001039a8;
            uVar11 = uVar11 / 10000;
            uVar3 = __len + 4;
          } while (99999 < uVar9);
          __len = __len + 1;
        }
LAB_001039a8:
        local_58[0] = (QPDFObjGen)local_48;
        std::__cxx11::string::_M_construct((ulong)local_58,(char)__len - (char)((int)uVar1 >> 0x1f))
        ;
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_58[0]),__len,__val);
        std::__cxx11::string::operator=((string *)&local_88,(string *)local_58);
        if (local_58[0] != (QPDFObjGen)local_48) {
          operator_delete((void *)local_58[0],local_48[0] + 1);
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ -> ",5);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_88,local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ] ",3);
    if (local_68.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
  }
  QPDFOutlineObjectHelper::getTitle_abi_cxx11_();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_88,local_80);
  local_58[0].obj._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_58,1);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return;
}

Assistant:

void
show_bookmark_details(QPDFOutlineObjectHelper outline, std::vector<int> numbers)
{
    // No default so gcc will warn on missing tag
    switch (style) {
    case st_none:
        QTC::TC("examples", "pdf-bookmarks none");
        break;

    case st_numbers:
        QTC::TC("examples", "pdf-bookmarks numbers");
        for (auto const& number: numbers) {
            std::cout << number << ".";
        }
        std::cout << " ";
        break;

    case st_lines:
        QTC::TC("examples", "pdf-bookmarks lines");
        print_lines(numbers);
        std::cout << "|" << std::endl;
        print_lines(numbers);
        std::cout << "+-+ ";
        break;
    }

    if (show_open) {
        int count = outline.getCount();
        if (count) {
            QTC::TC("examples", "pdf-bookmarks has count");
            if (count > 0) {
                // hierarchy is open at this point
                QTC::TC("examples", "pdf-bookmarks open");
                std::cout << "(v) ";
            } else {
                QTC::TC("examples", "pdf-bookmarks closed");
                std::cout << "(>) ";
            }
        } else {
            QTC::TC("examples", "pdf-bookmarks no count");
            std::cout << "( ) ";
        }
    }

    if (show_targets) {
        QTC::TC("examples", "pdf-bookmarks targets");
        std::string target = "unknown";
        QPDFObjectHandle dest_page = outline.getDestPage();
        if (!dest_page.isNull()) {
            QTC::TC("examples", "pdf-bookmarks dest");
            if (page_map.count(dest_page)) {
                target = std::to_string(page_map[dest_page]);
            }
        }
        std::cout << "[ -> " << target << " ] ";
    }

    std::cout << outline.getTitle() << '\n';
}